

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int capacity;
  ostream *poVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  int i;
  long lVar5;
  long lVar6;
  long lVar7;
  allocator local_14ce;
  allocator local_14cd;
  int local_14cc;
  char **local_14c8;
  ulong local_14c0;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  PathOram oram;
  
  local_14c8 = argv;
  std::__cxx11::string::string((string *)&oram,argv[1],(allocator *)&counter);
  iVar1 = std::__cxx11::stoi((string *)&oram,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&oram);
  std::__cxx11::string::string((string *)&oram,local_14c8[2],(allocator *)&counter);
  capacity = std::__cxx11::stoi((string *)&oram,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&oram);
  PathOram::PathOram(&oram,iVar1,capacity);
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &counter._M_t._M_impl.super__Rb_tree_header._M_header;
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  counter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  counter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       counter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting warmming up with ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x100000);
  poVar2 = std::operator<<(poVar2," operations.");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar7 = (long)(1 << ((byte)iVar1 & 0x1f));
  lVar6 = 0x100000;
  if (0x100000 < lVar7) {
    lVar6 = lVar7;
  }
  for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
    PathOram::access(&oram,(char *)(lVar5 % lVar7 & 0xffffffff),(int)(lVar5 % lVar7));
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Warmup completed.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_14c0 = 1;
  lVar6 = 0;
  local_14cc = capacity;
  do {
    uVar3 = local_14c0 / 1000000;
    iVar1 = PathOram::access(&oram,(char *)(lVar6 % lVar7 & 0xffffffff),(int)(lVar6 % lVar7));
    if ((char)iVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cout,"tree oram invariance is broken");
      poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    iVar1 = TreeOram::stash_size(&oram.super_TreeOram);
    local_1448._M_dataplus._M_p = (pointer)(long)iVar1;
    pmVar4 = std::
             map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             ::operator[](&counter,(key_type *)&local_1448);
    *pmVar4 = *pmVar4 + 1;
    if (uVar3 * 1000000 + -1 == lVar6) {
      std::__cxx11::string::string((string *)&local_1468,"path",&local_14cd);
      std::operator+(&local_1448,&local_1468,"_");
      std::__cxx11::string::string((string *)&local_1488,local_14c8[1],&local_14ce);
      std::operator+(&local_1428,&local_1448,&local_1488);
      pruint64_t(lVar6 + 1,&counter,&local_1428,local_14cc);
      std::__cxx11::string::~string((string *)&local_1428);
      std::__cxx11::string::~string((string *)&local_1488);
      std::__cxx11::string::~string((string *)&local_1448);
      std::__cxx11::string::~string((string *)&local_1468);
    }
    local_14c0 = local_14c0 + 1;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int main(int argc, char ** argv )
{
   int logN = stoi(string(argv[1]));
   int cap = stoi(string(argv[2]));
   long long N = (1<<logN);
   PathOram oram(logN, cap);
   long long i = 0;
   int warmup = 1<<20;
   map<long long, long long> counter;
   
   cout <<"Starting warmming up with "<<warmup<<" operations."<<endl;
   for(int i = 0; i < (N > warmup ? N : warmup); ++i)
      oram.access(i%N);
   i = 0;
   cout <<"Warmup completed."<<endl;
   while(true)
   {
      bool res = oram.access(i%N);
      if(not res)
      {
         cout<<"tree oram invariance is broken"<<i<<endl;
      }
      ++counter[oram.stash_size()];
      ++i;
      if((i%1000000) == 0)
         pruint64_t(i, counter, string("path")+"_"+string(argv[1]), cap);
   }
}